

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_GetGammas(ARKodeMem ark_mem,sunrealtype *gamma,sunrealtype *gamrat,int **jcur,
                     int *dgamma_fail)

{
  long *in_RCX;
  double *in_RDX;
  undefined8 *in_RSI;
  uint *in_R8;
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ARKodeMem in_stack_ffffffffffffffc8;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffffc8,
                       (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
  if (local_4 == 0) {
    *in_RSI = in_stack_ffffffffffffffc8->step_printallstats;
    *in_RDX = (double)in_stack_ffffffffffffffc8->step_resize;
    *in_RCX = (long)&in_stack_ffffffffffffffc8->step_disablelsetup;
    *in_R8 = (uint)((double)in_stack_ffffffffffffffc8->step_reset <= ABS(*in_RDX - 1.0));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStep_GetGammas(ARKodeMem ark_mem, sunrealtype* gamma, sunrealtype* gamrat,
                      sunbooleantype** jcur, sunbooleantype* dgamma_fail)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set outputs */
  *gamma       = step_mem->gamma;
  *gamrat      = step_mem->gamrat;
  *jcur        = &step_mem->jcur;
  *dgamma_fail = (SUNRabs(*gamrat - ONE) >= step_mem->dgmax);

  return (ARK_SUCCESS);
}